

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bss_section.cpp
# Opt level: O0

void __thiscall BssSectionImport_MissingSize_Test::TestBody(BssSectionImport_MissingSize_Test *this)

{
  bool bVar1;
  char *pcVar2;
  error_code *lhs;
  error_code eVar3;
  not_null<pstore::repo::section_content_*> in_stack_fffffffffffffca8;
  AssertHelper local_2f8;
  Message local_2f0;
  error_code local_2e8;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_2a8;
  Message local_2a0;
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_;
  undefined1 local_278 [136];
  string local_1f0 [32];
  parser<pstore::exchange::import_ns::callbacks> local_1d0;
  parser<pstore::exchange::import_ns::callbacks> *local_128;
  parser<pstore::exchange::import_ns::callbacks> *parser;
  section_content imported_content;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  local_30;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  BssSectionImport_MissingSize_Test *this_local;
  
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
            *)&inserter);
  local_30 = std::
             back_inserter<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>
                       ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                         *)&inserter);
  pstore::repo::section_content::section_content((section_content *)&parser);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"{ \"align\":8 }",(allocator *)(local_278 + 0x87));
  local_278._112_8_ = 0;
  local_278._120_8_ = (mutex_type *)0x0;
  local_278._96_8_ = 0;
  local_278._104_8_ = 0;
  local_278._80_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278._88_8_ = (_Hash_node_base *)0x0;
  local_278._64_8_ = (pointer)0x0;
  local_278._72_8_ = (element_type *)0x0;
  local_278._48_8_ = (_List_node_base *)0x0;
  local_278._56_8_ = (_List_node_base *)0x0;
  local_278._32_8_ =
       (__uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
        )0x0;
  local_278._40_8_ =
       (__uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>)0x0;
  local_278._16_8_ = (pointer)0x0;
  local_278._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278._0_8_ = (pointer)0x0;
  local_278._8_8_ =
       (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )0x0;
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)local_278);
  pstore::gsl::not_null<pstore::repo::section_content_*>::not_null
            ((not_null<pstore::repo::section_content_*> *)&gtest_ar_.message_,
             (section_content *)&parser);
  (anonymous_namespace)::
  parse<(pstore::repo::section_kind)2,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
            (&local_1d0,(_anonymous_namespace_ *)local_1f0,
             (string *)&(this->super_BssSectionImport).db_,(database *)local_278,
             (string_mapping *)&stack0xffffffffffffffd0,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,in_stack_fffffffffffffca8);
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_278);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)(local_278 + 0x87));
  local_128 = &local_1d0;
  local_291 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error(local_128);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_290,(AssertionResult *)0x2ecd1e,
               "false","true",
               (char *)gtest_ar_.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
               ,0x10e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  lhs = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error(local_128);
  eVar3 = pstore::exchange::import_ns::make_error_code(bss_section_was_incomplete);
  local_2e8._M_cat = eVar3._M_cat;
  local_2e8._M_value = eVar3._M_value;
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_2d8,"parser.last_error ()",
             "make_error_code (pstore::exchange::import_ns::error::bss_section_was_incomplete)",lhs,
             &local_2e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_bss_section.cpp"
               ,0x110,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&local_1d0);
  pstore::repo::section_content::~section_content((section_content *)&parser);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
             *)&inserter);
  return;
}

Assistant:

TEST_F (BssSectionImport, MissingSize) {
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);
    pstore::repo::section_content imported_content;

    // The data value is missing.
    auto const & parser = parse<pstore::repo::section_kind::bss> (
        R"({ "align":8 })", &db_, pstore::exchange::import_ns::string_mapping{}, &inserter,
        &imported_content);
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::bss_section_was_incomplete));
}